

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O0

void so_5::impl::msg_tracing_helpers::details::
     make_trace<so_5::agent_t*const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,so_5::impl::msg_tracing_helpers::details::mbox_identification,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::state_t_const*,so_5::impl::event_handler_data_t_const*&>
               (tracer_t *tracer,agent_t **args,composed_action_name *args_1,
               mbox_identification *args_2,type_index *args_3,
               intrusive_ptr_t<so_5::message_t> *args_4,state_t **args_5,
               event_handler_data_t **args_6)

{
  ostream *__out;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  string local_1d8 [32];
  native_handle_type local_1b8;
  ostringstream local_1b0 [8];
  ostringstream s;
  intrusive_ptr_t<so_5::message_t> *args_local_4;
  type_index *args_local_3;
  mbox_identification *args_local_2;
  composed_action_name *args_local_1;
  agent_t **args_local;
  tracer_t *tracer_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  __out = std::operator<<((ostream *)local_1b0,"[tid=");
  local_1b8 = (native_handle_type)query_current_thread_id();
  pbVar1 = std::operator<<(__out,(id)local_1b8);
  std::operator<<(pbVar1,"]");
  make_trace_to<so_5::agent_t*const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,so_5::impl::msg_tracing_helpers::details::mbox_identification,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::state_t_const*,so_5::impl::event_handler_data_t_const*&>
            ((ostream *)local_1b0,args,args_1,args_2,args_3,args_4,args_5,args_6);
  std::__cxx11::ostringstream::str();
  (*tracer->_vptr_tracer_t[2])(tracer,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return;
}

Assistant:

void
make_trace(
	so_5::msg_tracing::tracer_t & tracer,
	ARGS &&... args ) SO_5_NOEXCEPT
	{
#if !defined( SO_5_HAVE_NOEXCEPT )
		so_5::details::invoke_noexcept_code( [&] {
#endif
				std::ostringstream s;

				s << "[tid=" << query_current_thread_id() << "]";

				make_trace_to( s, std::forward< ARGS >(args)... );

				tracer.trace( s.str() );
#if !defined( SO_5_HAVE_NOEXCEPT )
			} );
#endif
	}